

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O2

TestCaseGroup * vkt::SpirVAssembly::createOpConstantCompositeTests(TestContext *testCtx)

{
  NameConstantsCode *pNVar1;
  TestCaseGroup *pTVar2;
  mapped_type *pmVar3;
  long lVar4;
  char *pcVar5;
  char *pcVar6;
  byte bVar7;
  allocator<char> local_3b2;
  allocator<char> local_3b1;
  allocator<char> local_3b0;
  allocator<char> local_3af;
  allocator<char> local_3ae;
  allocator<char> local_3ad;
  allocator<char> local_3ac;
  allocator<char> local_3ab;
  allocator<char> local_3aa;
  allocator<char> local_3a9;
  NameConstantsCode *local_3a8;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> opConstantCompositeTests;
  key_type local_390;
  long local_370;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  fragments;
  undefined8 local_338;
  undefined8 uStack_330;
  RGBA inputColors [4];
  key_type local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  char functionEnd [48];
  NameConstantsCode tests [5];
  char functionStart [108];
  
  bVar7 = 0;
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar2,testCtx,"opconstantcomposite","OpConstantComposite instruction");
  inputColors[0].m_value = 0;
  inputColors[1].m_value = 0;
  inputColors[2].m_value = 0;
  inputColors[3].m_value = 0;
  local_338._0_4_ = 0;
  local_338._4_4_ = 0;
  uStack_330._0_4_ = 0;
  uStack_330._4_4_ = 0;
  pcVar5 = 
  "%test_code = OpFunction %v4f32 None %v4f32_function\n%param1 = OpFunctionParameter %v4f32\n%lbl    = OpLabel\n"
  ;
  pcVar6 = functionStart;
  for (lVar4 = 0x6c; lVar4 != 0; lVar4 = lVar4 + -1) {
    *pcVar6 = *pcVar5;
    pcVar5 = pcVar5 + (ulong)bVar7 * -2 + 1;
    pcVar6 = pcVar6 + (ulong)bVar7 * -2 + 1;
  }
  builtin_strncpy(functionEnd + 0x20,"\nOpFunctionEnd\n",0x10);
  builtin_strncpy(functionEnd + 0x10,"ransformed_param",0x10);
  builtin_strncpy(functionEnd,"OpReturnValue %t",0x10);
  opConstantCompositeTests.
  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr = pTVar2;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)tests,"vec4",(allocator<char> *)&fragments);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tests[0].constants,
             "%cval              = OpConstantComposite %v4f32 %c_f32_0_5 %c_f32_0_5 %c_f32_0_5 %c_f32_0\n"
             ,(allocator<char> *)&local_390);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tests[0].code,"%transformed_param = OpFAdd %v4f32 %param1 %cval\n",
             (allocator<char> *)&local_2d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(tests + 1),"struct",(allocator<char> *)&local_2f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tests[1].constants,
             "%stype             = OpTypeStruct %v4f32 %f32\n%fp_stype          = OpTypePointer Function %stype\n%f32_n_1           = OpConstant %f32 -1.0\n%f32_1_5           = OpConstant %f32 !0x3fc00000\n%cvec              = OpConstantComposite %v4f32 %f32_1_5 %f32_1_5 %f32_1_5 %c_f32_1\n%cval              = OpConstantComposite %stype %cvec %f32_n_1\n"
             ,(allocator<char> *)&local_318);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tests[1].code,
             "%v                 = OpVariable %fp_stype Function %cval\n%vec_ptr           = OpAccessChain %fp_v4f32 %v %c_u32_0\n%f32_ptr           = OpAccessChain %fp_f32 %v %c_u32_1\n%vec_val           = OpLoad %v4f32 %vec_ptr\n%f32_val           = OpLoad %f32 %f32_ptr\n%tmp1              = OpVectorTimesScalar %v4f32 %c_v4f32_1_1_1_1 %f32_val\n%tmp2              = OpFAdd %v4f32 %tmp1 %param1\n%transformed_param = OpFAdd %v4f32 %tmp2 %vec_val\n"
             ,&local_3b1);
  std::__cxx11::string::string<std::allocator<char>>((string *)(tests + 2),"matrix",&local_3b2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tests[2].constants,
             "%mat4x4_f32          = OpTypeMatrix %v4f32 4\n%v4f32_1_0_0_0       = OpConstantComposite %v4f32 %c_f32_1 %c_f32_0 %c_f32_0 %c_f32_0\n%v4f32_0_1_0_0       = OpConstantComposite %v4f32 %c_f32_0 %c_f32_1 %c_f32_0 %c_f32_0\n%v4f32_0_0_1_0       = OpConstantComposite %v4f32 %c_f32_0 %c_f32_0 %c_f32_1 %c_f32_0\n%v4f32_0_5_0_5_0_5_1 = OpConstantComposite %v4f32 %c_f32_0_5 %c_f32_0_5 %c_f32_0_5 %c_f32_1\n%cval                = OpConstantComposite %mat4x4_f32 %v4f32_1_0_0_0 %v4f32_0_1_0_0 %v4f32_0_0_1_0 %v4f32_0_5_0_5_0_5_1\n"
             ,&local_3a9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tests[2].code,
             "%transformed_param   = OpMatrixTimesVector %v4f32 %cval %param1\n",&local_3aa);
  std::__cxx11::string::string<std::allocator<char>>((string *)(tests + 3),"array",&local_3ab);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tests[3].constants,
             "%c_v4f32_1_1_1_0     = OpConstantComposite %v4f32 %c_f32_1 %c_f32_1 %c_f32_1 %c_f32_0\n%fp_a4f32            = OpTypePointer Function %a4f32\n%f32_n_1             = OpConstant %f32 -1.0\n%f32_1_5             = OpConstant %f32 !0x3fc00000\n%carr                = OpConstantComposite %a4f32 %c_f32_0 %f32_n_1 %f32_1_5 %c_f32_0\n"
             ,&local_3ac);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tests[3].code,
             "%v                   = OpVariable %fp_a4f32 Function %carr\n%f                   = OpAccessChain %fp_f32 %v %c_u32_0\n%f1                  = OpAccessChain %fp_f32 %v %c_u32_1\n%f2                  = OpAccessChain %fp_f32 %v %c_u32_2\n%f3                  = OpAccessChain %fp_f32 %v %c_u32_3\n%f_val               = OpLoad %f32 %f\n%f1_val              = OpLoad %f32 %f1\n%f2_val              = OpLoad %f32 %f2\n%f3_val              = OpLoad %f32 %f3\n%ftot1               = OpFAdd %f32 %f_val %f1_val\n%ftot2               = OpFAdd %f32 %ftot1 %f2_val\n%ftot3               = OpFAdd %f32 %ftot2 %f3_val\n%add_vec             = OpVectorTimesScalar %v4f32 %c_v4f32_1_1_1_0 %ftot3\n%transformed_param   = OpFAdd %v4f32 %param1 %add_vec\n"
             ,&local_3ad);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(tests + 4),"array_of_struct_of_array",&local_3ae);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tests[4].constants,
             "%c_v4f32_1_1_1_0     = OpConstantComposite %v4f32 %c_f32_1 %c_f32_1 %c_f32_1 %c_f32_0\n%fp_a4f32            = OpTypePointer Function %a4f32\n%stype               = OpTypeStruct %f32 %a4f32\n%a3stype             = OpTypeArray %stype %c_u32_3\n%fp_a3stype          = OpTypePointer Function %a3stype\n%ca4f32_0            = OpConstantComposite %a4f32 %c_f32_0 %c_f32_0_5 %c_f32_0 %c_f32_0\n%ca4f32_1            = OpConstantComposite %a4f32 %c_f32_1 %c_f32_1 %c_f32_1 %c_f32_1\n%cstype1             = OpConstantComposite %stype %c_f32_0 %ca4f32_1\n%cstype2             = OpConstantComposite %stype %c_f32_1 %ca4f32_0\n%carr                = OpConstantComposite %a3stype %cstype1 %cstype2 %cstype1"
             ,&local_3af);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tests[4].code,
             "%v                   = OpVariable %fp_a3stype Function %carr\n%f                   = OpAccessChain %fp_f32 %v %c_u32_1 %c_u32_1 %c_u32_1\n%f_l                 = OpLoad %f32 %f\n%add_vec             = OpVectorTimesScalar %v4f32 %c_v4f32_1_1_1_0 %f_l\n%transformed_param   = OpFAdd %v4f32 %param1 %add_vec\n"
             ,&local_3b0);
  local_3a8 = tests;
  getHalfColorsFullAlpha(&inputColors);
  local_338._0_4_ = 0xffffffff;
  local_338._4_4_ = 0xff7f7fff;
  uStack_330._0_4_ = 0xff7fff7f;
  uStack_330._4_4_ = 0xffff7f7f;
  lVar4 = 5;
  while( true ) {
    pTVar2 = opConstantCompositeTests.
             super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
             ptr;
    if (lVar4 == 0) break;
    fragments._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    fragments._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    fragments._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &fragments._M_t._M_impl.super__Rb_tree_header._M_header;
    fragments._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    fragments._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         fragments._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_390,"pre_main",(allocator<char> *)&local_2d8);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&fragments,&local_390);
    std::__cxx11::string::_M_assign((string *)pmVar3);
    std::__cxx11::string::~string((string *)&local_390);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2f8,functionStart,&local_3b1);
    std::operator+(&local_2d8,&local_2f8,&local_3a8->code);
    std::operator+(&local_390,&local_2d8,functionEnd);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_318,"testfun",&local_3b2);
    local_370 = lVar4 + -1;
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&fragments,&local_318);
    std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_390);
    std::__cxx11::string::~string((string *)&local_318);
    std::__cxx11::string::~string((string *)&local_390);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::__cxx11::string::~string((string *)&local_2f8);
    pNVar1 = local_3a8;
    local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
    local_390._M_string_length = 0;
    local_390.field_2._M_local_buf[0] = '\0';
    createTestsForAllStages
              (&local_3a8->name,&inputColors,(RGBA (*) [4])&local_338,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&fragments._M_t,
               opConstantCompositeTests.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
               ptr,QP_TEST_RESULT_FAIL,&local_390);
    std::__cxx11::string::~string((string *)&local_390);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&fragments._M_t);
    local_3a8 = pNVar1 + 1;
    lVar4 = local_370;
  }
  opConstantCompositeTests.
  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       (TestCaseGroup *)0x0;
  lVar4 = 0x180;
  do {
    createOpConstantCompositeTests::NameConstantsCode::~NameConstantsCode
              ((NameConstantsCode *)((long)&tests[0].name._M_dataplus._M_p + lVar4));
    lVar4 = lVar4 + -0x60;
  } while (lVar4 != -0x60);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&opConstantCompositeTests.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  return pTVar2;
}

Assistant:

tcu::TestCaseGroup* createOpConstantCompositeTests(tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> opConstantCompositeTests		(new tcu::TestCaseGroup(testCtx, "opconstantcomposite", "OpConstantComposite instruction"));
	RGBA							inputColors[4];
	RGBA							outputColors[4];


	const char						functionStart[]	 =
		"%test_code = OpFunction %v4f32 None %v4f32_function\n"
		"%param1 = OpFunctionParameter %v4f32\n"
		"%lbl    = OpLabel\n";

	const char						functionEnd[]		=
		"OpReturnValue %transformed_param\n"
		"OpFunctionEnd\n";

	struct NameConstantsCode
	{
		string name;
		string constants;
		string code;
	};

	NameConstantsCode tests[] =
	{
		{
			"vec4",

			"%cval              = OpConstantComposite %v4f32 %c_f32_0_5 %c_f32_0_5 %c_f32_0_5 %c_f32_0\n",
			"%transformed_param = OpFAdd %v4f32 %param1 %cval\n"
		},
		{
			"struct",

			"%stype             = OpTypeStruct %v4f32 %f32\n"
			"%fp_stype          = OpTypePointer Function %stype\n"
			"%f32_n_1           = OpConstant %f32 -1.0\n"
			"%f32_1_5           = OpConstant %f32 !0x3fc00000\n" // +1.5
			"%cvec              = OpConstantComposite %v4f32 %f32_1_5 %f32_1_5 %f32_1_5 %c_f32_1\n"
			"%cval              = OpConstantComposite %stype %cvec %f32_n_1\n",

			"%v                 = OpVariable %fp_stype Function %cval\n"
			"%vec_ptr           = OpAccessChain %fp_v4f32 %v %c_u32_0\n"
			"%f32_ptr           = OpAccessChain %fp_f32 %v %c_u32_1\n"
			"%vec_val           = OpLoad %v4f32 %vec_ptr\n"
			"%f32_val           = OpLoad %f32 %f32_ptr\n"
			"%tmp1              = OpVectorTimesScalar %v4f32 %c_v4f32_1_1_1_1 %f32_val\n" // vec4(-1)
			"%tmp2              = OpFAdd %v4f32 %tmp1 %param1\n" // param1 + vec4(-1)
			"%transformed_param = OpFAdd %v4f32 %tmp2 %vec_val\n" // param1 + vec4(-1) + vec4(1.5, 1.5, 1.5, 1.0)
		},
		{
			// [1|0|0|0.5] [x] = x + 0.5
			// [0|1|0|0.5] [y] = y + 0.5
			// [0|0|1|0.5] [z] = z + 0.5
			// [0|0|0|1  ] [1] = 1
			"matrix",

			"%mat4x4_f32          = OpTypeMatrix %v4f32 4\n"
		    "%v4f32_1_0_0_0       = OpConstantComposite %v4f32 %c_f32_1 %c_f32_0 %c_f32_0 %c_f32_0\n"
		    "%v4f32_0_1_0_0       = OpConstantComposite %v4f32 %c_f32_0 %c_f32_1 %c_f32_0 %c_f32_0\n"
		    "%v4f32_0_0_1_0       = OpConstantComposite %v4f32 %c_f32_0 %c_f32_0 %c_f32_1 %c_f32_0\n"
		    "%v4f32_0_5_0_5_0_5_1 = OpConstantComposite %v4f32 %c_f32_0_5 %c_f32_0_5 %c_f32_0_5 %c_f32_1\n"
			"%cval                = OpConstantComposite %mat4x4_f32 %v4f32_1_0_0_0 %v4f32_0_1_0_0 %v4f32_0_0_1_0 %v4f32_0_5_0_5_0_5_1\n",

			"%transformed_param   = OpMatrixTimesVector %v4f32 %cval %param1\n"
		},
		{
			"array",

			"%c_v4f32_1_1_1_0     = OpConstantComposite %v4f32 %c_f32_1 %c_f32_1 %c_f32_1 %c_f32_0\n"
			"%fp_a4f32            = OpTypePointer Function %a4f32\n"
			"%f32_n_1             = OpConstant %f32 -1.0\n"
			"%f32_1_5             = OpConstant %f32 !0x3fc00000\n" // +1.5
			"%carr                = OpConstantComposite %a4f32 %c_f32_0 %f32_n_1 %f32_1_5 %c_f32_0\n",

			"%v                   = OpVariable %fp_a4f32 Function %carr\n"
			"%f                   = OpAccessChain %fp_f32 %v %c_u32_0\n"
			"%f1                  = OpAccessChain %fp_f32 %v %c_u32_1\n"
			"%f2                  = OpAccessChain %fp_f32 %v %c_u32_2\n"
			"%f3                  = OpAccessChain %fp_f32 %v %c_u32_3\n"
			"%f_val               = OpLoad %f32 %f\n"
			"%f1_val              = OpLoad %f32 %f1\n"
			"%f2_val              = OpLoad %f32 %f2\n"
			"%f3_val              = OpLoad %f32 %f3\n"
			"%ftot1               = OpFAdd %f32 %f_val %f1_val\n"
			"%ftot2               = OpFAdd %f32 %ftot1 %f2_val\n"
			"%ftot3               = OpFAdd %f32 %ftot2 %f3_val\n"  // 0 - 1 + 1.5 + 0
			"%add_vec             = OpVectorTimesScalar %v4f32 %c_v4f32_1_1_1_0 %ftot3\n"
			"%transformed_param   = OpFAdd %v4f32 %param1 %add_vec\n"
		},
		{
			//
			// [
			//   {
			//      0.0,
			//      [ 1.0, 1.0, 1.0, 1.0]
			//   },
			//   {
			//      1.0,
			//      [ 0.0, 0.5, 0.0, 0.0]
			//   }, //     ^^^
			//   {
			//      0.0,
			//      [ 1.0, 1.0, 1.0, 1.0]
			//   }
			// ]
			"array_of_struct_of_array",

			"%c_v4f32_1_1_1_0     = OpConstantComposite %v4f32 %c_f32_1 %c_f32_1 %c_f32_1 %c_f32_0\n"
			"%fp_a4f32            = OpTypePointer Function %a4f32\n"
			"%stype               = OpTypeStruct %f32 %a4f32\n"
			"%a3stype             = OpTypeArray %stype %c_u32_3\n"
			"%fp_a3stype          = OpTypePointer Function %a3stype\n"
			"%ca4f32_0            = OpConstantComposite %a4f32 %c_f32_0 %c_f32_0_5 %c_f32_0 %c_f32_0\n"
			"%ca4f32_1            = OpConstantComposite %a4f32 %c_f32_1 %c_f32_1 %c_f32_1 %c_f32_1\n"
			"%cstype1             = OpConstantComposite %stype %c_f32_0 %ca4f32_1\n"
			"%cstype2             = OpConstantComposite %stype %c_f32_1 %ca4f32_0\n"
			"%carr                = OpConstantComposite %a3stype %cstype1 %cstype2 %cstype1",

			"%v                   = OpVariable %fp_a3stype Function %carr\n"
			"%f                   = OpAccessChain %fp_f32 %v %c_u32_1 %c_u32_1 %c_u32_1\n"
			"%f_l                 = OpLoad %f32 %f\n"
			"%add_vec             = OpVectorTimesScalar %v4f32 %c_v4f32_1_1_1_0 %f_l\n"
			"%transformed_param   = OpFAdd %v4f32 %param1 %add_vec\n"
		}
	};

	getHalfColorsFullAlpha(inputColors);
	outputColors[0] = RGBA(255, 255, 255, 255);
	outputColors[1] = RGBA(255, 127, 127, 255);
	outputColors[2] = RGBA(127, 255, 127, 255);
	outputColors[3] = RGBA(127, 127, 255, 255);

	for (size_t testNdx = 0; testNdx < sizeof(tests) / sizeof(NameConstantsCode); ++testNdx)
	{
		map<string, string> fragments;
		fragments["pre_main"] = tests[testNdx].constants;
		fragments["testfun"] = string(functionStart) + tests[testNdx].code + functionEnd;
		createTestsForAllStages(tests[testNdx].name, inputColors, outputColors, fragments, opConstantCompositeTests.get());
	}
	return opConstantCompositeTests.release();
}